

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O1

void define_print(TCCState *s1,int v)

{
  int v_00;
  FILE *pFVar1;
  char *pcVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  Sym *pSVar6;
  int *piVar7;
  Sym *pSVar8;
  long lVar9;
  CValue local_48;
  
  if (v - 0x100U < tok_ident - 0x100U) {
    pSVar8 = table_ident[(int)(v - 0x100U)]->sym_define;
  }
  else {
    pSVar8 = (Sym *)0x0;
  }
  if ((pSVar8 != (Sym *)0x0) && ((pSVar8->field_3).enum_val != 0)) {
    pFVar1 = (FILE *)s1->ppfp;
    pcVar2 = get_tok_str(v,(CValue *)0x0);
    fprintf(pFVar1,"#define %s",pcVar2);
    if ((pSVar8->type).t == 1) {
      pSVar6 = (pSVar8->field_5).next;
      fputc(0x28,pFVar1);
      if (pSVar6 != (Sym *)0x0) {
        while( true ) {
          pcVar2 = get_tok_str(pSVar6->v & 0xdfffffff,(CValue *)0x0);
          fputs(pcVar2,pFVar1);
          pSVar6 = (pSVar6->field_5).next;
          if (pSVar6 == (Sym *)0x0) break;
          fputc(0x2c,pFVar1);
        }
      }
      fputc(0x29,pFVar1);
    }
    piVar7 = (pSVar8->field_3).d;
    pFVar1 = (FILE *)tcc_state->ppfp;
    fputs("",pFVar1);
    if (piVar7 != (int *)0x0) {
      lVar9 = 0;
      do {
        piVar3 = piVar7 + 1;
        v_00 = *piVar7;
        switch(v_00) {
        case 0xb3:
        case 0xb4:
        case 0xb5:
        case 0xc0:
          local_48.d = (double)(long)piVar7[1];
          goto LAB_00126542;
        case 0xb6:
          local_48.d = (double)(ulong)(uint)piVar7[1];
LAB_00126542:
          piVar3 = piVar7 + 2;
          break;
        case 0xb7:
        case 0xb8:
        case 0xbc:
        case 0xce:
        case 0xcf:
          iVar4 = 2;
          goto LAB_00126521;
        case 0xb9:
        case 0xba:
        case 0xbe:
        case 0xbf:
          local_48.str.data = piVar7 + 2;
          local_48.str.size = piVar7[1];
          piVar3 = (int *)((long)piVar7 + ((long)piVar7[1] + 3U & 0xfffffffffffffffc) + 8);
          break;
        case 0xbb:
          piVar3 = piVar7 + 2;
          local_48.f = (float)piVar7[1];
          break;
        case 0xbd:
          iVar4 = 4;
LAB_00126521:
          lVar5 = 0;
          do {
            *(undefined4 *)((long)&local_48 + lVar5) = *(undefined4 *)((long)piVar3 + lVar5);
            lVar5 = lVar5 + 4;
          } while (iVar4 << 2 != (int)lVar5);
          piVar3 = (int *)((long)piVar3 + lVar5);
switchD_0012651a_caseD_c1:
          break;
        default:
          goto switchD_0012651a_caseD_c1;
        }
        if (v_00 == 0) break;
        pcVar2 = get_tok_str(v_00,&local_48);
        fprintf(pFVar1,"field not found: %s" + lVar9 + 0x10,pcVar2);
        lVar9 = 1;
        piVar7 = piVar3;
      } while (piVar3 != (int *)0x0);
    }
    fputc(10,pFVar1);
  }
  return;
}

Assistant:

static void define_print(TCCState* s1, int v) {
  FILE* fp;
  Sym* s;

  s = define_find(v);
  if (NULL == s || NULL == s->d)
    return;

  fp = s1->ppfp;
  fprintf(fp, "#define %s", get_tok_str(v, NULL));
  if (s->type.t == MACRO_FUNC) {
    Sym* a = s->next;
    fprintf(fp, "(");
    if (a)
      for (;;) {
        fprintf(fp, "%s", get_tok_str(a->v & ~SYM_FIELD, NULL));
        if (!(a = a->next))
          break;
        fprintf(fp, ",");
      }
    fprintf(fp, ")");
  }
  tok_print("", s->d);
}